

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfer.cc
# Opt level: O0

Node __thiscall verona::Infer::do_block(Infer *this,Node *block)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  reference psVar3;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *this_01;
  Location *loc;
  reference node;
  Node *pNVar5;
  int __flags;
  iterator in_RCX;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Node *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Node NVar7;
  Token local_658;
  Token local_650;
  Token local_648;
  Token local_640;
  initializer_list<trieste::Token> local_638;
  int local_624;
  shared_ptr<trieste::NodeDef> local_620;
  Token local_610;
  shared_ptr<verona::BtypeDef> local_608;
  Token local_5f8;
  WFLookup local_5f0;
  shared_ptr<trieste::NodeDef> local_5d0;
  Node local_5c0;
  Token local_5b0;
  Token local_5a8;
  Token local_5a0;
  Token local_598;
  Token local_590;
  Token local_588;
  Token local_580;
  Token local_578;
  Token local_570;
  Token local_568;
  Token local_560;
  Token local_558;
  initializer_list<trieste::Token> local_550;
  shared_ptr<verona::BtypeDef> local_540;
  shared_ptr<trieste::NodeDef> local_530;
  Node *local_520;
  shared_ptr<trieste::NodeDef> *local_518;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_510;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_508;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_500;
  Token local_4f8;
  undefined1 local_4f0 [8];
  WFLookup args;
  WFLookup local_4c8;
  shared_ptr<trieste::NodeDef> local_4a8;
  undefined1 local_498 [8];
  Node ret;
  WFLookup local_480;
  shared_ptr<trieste::NodeDef> local_460;
  undefined1 local_450 [8];
  Node params;
  undefined1 local_430 [8];
  Lookup l;
  Token local_3e0;
  undefined1 local_3d8 [8];
  WFLookup sel;
  shared_ptr<verona::BtypeDef> local_3b0;
  Token local_3a0;
  WFLookup local_398;
  undefined1 local_378 [72];
  undefined1 local_330 [72];
  shared_ptr<trieste::NodeDef> local_2e8;
  Node local_2d8;
  Token local_2c8;
  shared_ptr<verona::BtypeDef> local_2c0;
  Token local_2b0;
  Token local_2a8;
  WFLookup local_2a0;
  Nodes local_280;
  WFLookup local_268;
  shared_ptr<trieste::NodeDef> local_248;
  Node local_238;
  Token local_228;
  WFLookup local_220;
  shared_ptr<trieste::NodeDef> local_200;
  Node local_1f0;
  EphemeralNode local_1e0;
  TokenDef local_1d0;
  Node local_1c0;
  Node local_1b0;
  Token local_1a0;
  shared_ptr<verona::BtypeDef> local_198;
  shared_ptr<trieste::NodeDef> local_188;
  Node local_178;
  Token local_168;
  Token local_160;
  initializer_list<trieste::Token> local_158;
  shared_ptr<verona::BtypeDef> local_148;
  Token local_138;
  WFLookup local_130;
  shared_ptr<trieste::NodeDef> local_110;
  Token local_100;
  shared_ptr<verona::BtypeDef> local_f8;
  shared_ptr<verona::BtypeDef> local_e8;
  Token local_d8;
  Token local_d0;
  WFLookup local_c8;
  shared_ptr<trieste::NodeDef> local_a8;
  undefined1 local_98 [8];
  Btype type;
  undefined1 local_80 [8];
  WFLookup rhs;
  Token local_50;
  undefined1 local_48 [8];
  shared_ptr<trieste::NodeDef> stmt;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  Node *block_local;
  Infer *this_local;
  
  peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_RDX);
  __end2._M_current = (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::begin(peVar2);
  stmt.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trieste::NodeDef::end(peVar2);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                           (&__end2,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                     *)&stmt.
                                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), ((bVar1 ^ 0xffU) & 1) != 0) {
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
             ::operator*(&__end2);
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)local_48,psVar3)
    ;
    trieste::Token::Token(&local_50,(TokenDef *)Bind);
    bVar1 = trieste::operator==((Node *)local_48,&local_50);
    if (bVar1) {
      trieste::Token::Token
                ((Token *)&type.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(TokenDef *)Rhs);
      trieste::operator/((WFLookup *)local_80,(Node *)local_48,
                         (Token *)&type.
                                   super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
      trieste::Token::Token(&local_d0,(TokenDef *)Type);
      trieste::operator/(&local_c8,(Node *)local_48,&local_d0);
      pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_c8);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_a8,pNVar5);
      make_btype((verona *)local_98,&local_a8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_a8);
      trieste::wf::detail::WFLookup::~WFLookup(&local_c8);
      pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_((WFLookup *)local_80);
      trieste::Token::Token(&local_d8,(TokenDef *)TypeTest);
      bVar1 = trieste::operator==(pNVar5,&local_d8);
      if (bVar1) {
        std::shared_ptr<verona::BtypeDef>::shared_ptr
                  (&local_e8,(shared_ptr<verona::BtypeDef> *)(block + 3));
        std::shared_ptr<verona::BtypeDef>::shared_ptr
                  (&local_f8,(shared_ptr<verona::BtypeDef> *)local_98);
        check((Infer *)block,(Btype *)&local_e8,(Btype *)&local_f8);
        std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_f8);
        std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_e8);
      }
      else {
        pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_((WFLookup *)local_80);
        trieste::Token::Token(&local_100,(TokenDef *)Cast);
        bVar1 = trieste::operator==(pNVar5,&local_100);
        if (bVar1) {
          trieste::Token::Token(&local_138,(TokenDef *)Type);
          trieste::wf::detail::WFLookup::operator/(&local_130,(WFLookup *)local_80,&local_138);
          pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_130);
          ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_110,pNVar5);
          std::shared_ptr<verona::BtypeDef>::shared_ptr
                    (&local_148,(shared_ptr<verona::BtypeDef> *)local_98);
          check((Infer *)block,&local_110,(Btype *)&local_148);
          std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_148);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_110);
          trieste::wf::detail::WFLookup::~WFLookup(&local_130);
        }
        else {
          p_Var4 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)trieste::wf::detail::WFLookup::operator->((WFLookup *)local_80);
          peVar2 = ::std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var4);
          trieste::Token::Token(&local_168,(TokenDef *)Move);
          trieste::Token::Token(&local_160,(TokenDef *)Copy);
          local_158._M_array = &local_168;
          local_158._M_len = 2;
          bVar1 = trieste::NodeDef::in(peVar2,&local_158);
          if (bVar1) {
            pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                               ((WFLookup *)local_80);
            ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_188,pNVar5);
            gamma((verona *)&local_178,extraout_XMM0_Qa);
            std::shared_ptr<verona::BtypeDef>::shared_ptr
                      (&local_198,(shared_ptr<verona::BtypeDef> *)local_98);
            check((Infer *)block,&local_178,(Btype *)&local_198);
            std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_198);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_178);
            ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_188);
          }
          else {
            pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                               ((WFLookup *)local_80);
            trieste::Token::Token(&local_1a0,(TokenDef *)FieldRef);
            bVar1 = trieste::operator==(pNVar5,&local_1a0);
            if (bVar1) {
              trieste::TokenDef::operator_cast_to_shared_ptr(&local_1d0);
              trieste::Token::Token(&local_228,(TokenDef *)Ref);
              trieste::wf::detail::WFLookup::operator/(&local_220,(WFLookup *)local_80,&local_228);
              pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_220);
              ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_200,pNVar5);
              gamma((verona *)&local_1f0,extraout_XMM0_Qa_00);
              trieste::operator-((trieste *)&local_1e0,&local_1f0);
              trieste::operator<<((trieste *)&local_1c0,(Node *)&local_1d0,&local_1e0);
              peVar2 = ::std::
                       __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(block + 1));
              trieste::Token::Token(&local_2a8,(TokenDef *)Ident);
              trieste::wf::detail::WFLookup::operator/(&local_2a0,(WFLookup *)local_80,&local_2a8);
              p_Var4 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)trieste::wf::detail::WFLookup::operator->(&local_2a0);
              this_01 = ::std::
                        __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->(p_Var4);
              loc = trieste::NodeDef::location(this_01);
              trieste::NodeDef::lookdown(&local_280,peVar2,loc);
              node = ::std::
                     vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ::front((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                              *)&local_280);
              trieste::Token::Token(&local_2b0,(TokenDef *)Type);
              trieste::operator/(&local_268,node,&local_2b0);
              pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_268);
              ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_248,pNVar5);
              reftype((verona *)&local_238,&local_248);
              trieste::operator<<((trieste *)&local_1b0,&local_1c0,&local_238);
              std::shared_ptr<verona::BtypeDef>::shared_ptr
                        (&local_2c0,(shared_ptr<verona::BtypeDef> *)local_98);
              check((Infer *)block,&local_1b0,(Btype *)&local_2c0);
              std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_2c0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1b0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_238);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_248);
              trieste::wf::detail::WFLookup::~WFLookup(&local_268);
              ::std::
              vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                         *)&local_280);
              trieste::wf::detail::WFLookup::~WFLookup(&local_2a0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1c0);
              trieste::detail::EphemeralNode::~EphemeralNode(&local_1e0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1f0);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_200);
              trieste::wf::detail::WFLookup::~WFLookup(&local_220);
              ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                        ((shared_ptr<trieste::NodeDef> *)&local_1d0);
            }
            else {
              pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                                 ((WFLookup *)local_80);
              trieste::Token::Token(&local_2c8,(TokenDef *)Conditional);
              bVar1 = trieste::operator==(pNVar5,&local_2c8);
              if (bVar1) {
                trieste::Token::Token((Token *)(local_330 + 0x20),(TokenDef *)If);
                trieste::wf::detail::WFLookup::operator/
                          ((WFLookup *)(local_330 + 0x28),(WFLookup *)local_80,
                           (Token *)(local_330 + 0x20));
                pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                                   ((WFLookup *)(local_330 + 0x28));
                ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_2e8,pNVar5);
                gamma((verona *)&local_2d8,extraout_XMM0_Qa_01);
                std::shared_ptr<verona::BtypeDef>::shared_ptr
                          ((shared_ptr<verona::BtypeDef> *)(local_330 + 0x10),
                           (shared_ptr<verona::BtypeDef> *)(block + 3));
                check((Infer *)block,&local_2d8,(Btype *)(local_330 + 0x10));
                std::shared_ptr<verona::BtypeDef>::~shared_ptr
                          ((shared_ptr<verona::BtypeDef> *)(local_330 + 0x10));
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2d8);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_2e8);
                trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)(local_330 + 0x28));
                trieste::Token::Token((Token *)(local_378 + 0x20),(TokenDef *)True);
                trieste::wf::detail::WFLookup::operator/
                          ((WFLookup *)(local_378 + 0x28),(WFLookup *)local_80,
                           (Token *)(local_378 + 0x20));
                trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                          ((WFLookup *)(local_378 + 0x28));
                do_block((Infer *)local_330,block);
                std::shared_ptr<verona::BtypeDef>::shared_ptr
                          ((shared_ptr<verona::BtypeDef> *)(local_378 + 0x10),
                           (shared_ptr<verona::BtypeDef> *)local_98);
                check((Infer *)block,(Node *)local_330,(Btype *)(local_378 + 0x10));
                std::shared_ptr<verona::BtypeDef>::~shared_ptr
                          ((shared_ptr<verona::BtypeDef> *)(local_378 + 0x10));
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                          ((shared_ptr<trieste::NodeDef> *)local_330);
                trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)(local_378 + 0x28));
                trieste::Token::Token(&local_3a0,(TokenDef *)False);
                trieste::wf::detail::WFLookup::operator/(&local_398,(WFLookup *)local_80,&local_3a0)
                ;
                trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_398);
                do_block((Infer *)local_378,block);
                std::shared_ptr<verona::BtypeDef>::shared_ptr
                          (&local_3b0,(shared_ptr<verona::BtypeDef> *)local_98);
                check((Infer *)block,(Node *)local_378,(Btype *)&local_3b0);
                std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_3b0);
                ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                          ((shared_ptr<trieste::NodeDef> *)local_378);
                trieste::wf::detail::WFLookup::~WFLookup(&local_398);
              }
              else {
                pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                                   ((WFLookup *)local_80);
                trieste::Token::Token((Token *)&sel.index,(TokenDef *)Call);
                bVar1 = trieste::operator==(pNVar5,(Token *)&sel.index);
                if (bVar1) {
                  trieste::Token::Token(&local_3e0,(TokenDef *)Selector);
                  trieste::wf::detail::WFLookup::operator/
                            ((WFLookup *)local_3d8,(WFLookup *)local_80,&local_3e0);
                  pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                                     ((WFLookup *)local_3d8);
                  trieste::Token::Token((Token *)&l.too_many_typeargs,(TokenDef *)FQFunction);
                  bVar1 = trieste::operator==(pNVar5,(Token *)&l.too_many_typeargs);
                  __flags = (int)in_RCX._M_current;
                  if (bVar1) {
                    pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_
                                       ((WFLookup *)local_3d8);
                    this_00 = &params.
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount;
                    ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                              ((shared_ptr<trieste::NodeDef> *)this_00,pNVar5);
                    resolve_fq((Lookup *)local_430,(Node *)this_00);
                    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                              ((shared_ptr<trieste::NodeDef> *)
                               &params.
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    trieste::Token::Token
                              ((Token *)&ret.
                                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount,(TokenDef *)Params);
                    trieste::operator/(&local_480,(Node *)local_430,
                                       (Token *)&ret.
                                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                    pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_480)
                    ;
                    ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_460,pNVar5);
                    trieste::clone((trieste *)local_450,(__fn *)&local_460,__child_stack,__flags,
                                   in_R8);
                    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_460);
                    trieste::wf::detail::WFLookup::~WFLookup(&local_480);
                    trieste::Token::Token((Token *)&args.index,(TokenDef *)Type);
                    trieste::operator/(&local_4c8,(Node *)local_430,(Token *)&args.index);
                    pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_4c8)
                    ;
                    ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_4a8,pNVar5);
                    trieste::clone((trieste *)local_498,(__fn *)&local_4a8,__child_stack_00,__flags,
                                   in_R8);
                    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_4a8);
                    trieste::wf::detail::WFLookup::~WFLookup(&local_4c8);
                    trieste::Token::Token(&local_4f8,(TokenDef *)Args);
                    trieste::wf::detail::WFLookup::operator/
                              ((WFLookup *)local_4f0,(WFLookup *)local_80,&local_4f8);
                    Lookup::sub((Lookup *)local_430,(Node *)local_450);
                    Lookup::sub((Lookup *)local_430,(Node *)local_498);
                    peVar2 = ::std::
                             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_450);
                    local_500._M_current =
                         (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::begin(peVar2);
                    peVar2 = ::std::
                             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_450);
                    local_508._M_current =
                         (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::end(peVar2);
                    p_Var4 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)trieste::wf::detail::WFLookup::operator->((WFLookup *)local_4f0);
                    peVar2 = ::std::
                             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->(p_Var4);
                    local_510._M_current =
                         (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::begin(peVar2);
                    p_Var4 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)trieste::wf::detail::WFLookup::operator->((WFLookup *)local_4f0);
                    peVar2 = ::std::
                             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->(p_Var4);
                    in_RCX = trieste::NodeDef::end(peVar2);
                    in_R8 = block;
                    local_520 = block;
                    local_518 = in_RCX._M_current;
                    ::std::
                    equal<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,verona::Infer::do_block(std::shared_ptr<trieste::NodeDef>&)::_lambda(std::shared_ptr<trieste::NodeDef>&,std::shared_ptr<trieste::NodeDef>&)_1_>
                              (local_500,local_508,local_510,
                               (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                )in_RCX._M_current,(anon_class_8_1_8991fb9c)block);
                    ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                              (&local_530,(shared_ptr<trieste::NodeDef> *)local_498);
                    std::shared_ptr<verona::BtypeDef>::shared_ptr
                              (&local_540,(shared_ptr<verona::BtypeDef> *)local_98);
                    check((Infer *)block,&local_530,(Btype *)&local_540);
                    std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_540);
                    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_530);
                    trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_4f0);
                    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                              ((shared_ptr<trieste::NodeDef> *)local_498);
                    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr
                              ((shared_ptr<trieste::NodeDef> *)local_450);
                    Lookup::~Lookup((Lookup *)local_430);
                  }
                  trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_3d8);
                }
                else {
                  p_Var4 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)trieste::wf::detail::WFLookup::operator->((WFLookup *)local_80);
                  peVar2 = ::std::
                           __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->(p_Var4);
                  trieste::Token::Token(&local_5a8,(TokenDef *)Int);
                  trieste::Token::Token(&local_5a0,(TokenDef *)Bin);
                  trieste::Token::Token(&local_598,(TokenDef *)Oct);
                  trieste::Token::Token(&local_590,(TokenDef *)Hex);
                  trieste::Token::Token(&local_588,(TokenDef *)Float);
                  trieste::Token::Token(&local_580,(TokenDef *)HexFloat);
                  trieste::Token::Token(&local_578,(TokenDef *)Char);
                  trieste::Token::Token(&local_570,(TokenDef *)Escaped);
                  trieste::Token::Token(&local_568,(TokenDef *)String);
                  trieste::Token::Token(&local_560,(TokenDef *)Tuple);
                  trieste::Token::Token(&local_558,(TokenDef *)LLVM);
                  local_550._M_array = &local_5a8;
                  local_550._M_len = 0xb;
                  bVar1 = trieste::NodeDef::in(peVar2,&local_550);
                  if (!bVar1) {
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                                  ,0x84,"Node verona::Infer::do_block(Node &)");
                  }
                }
              }
            }
          }
        }
      }
      std::shared_ptr<verona::BtypeDef>::~shared_ptr((shared_ptr<verona::BtypeDef> *)local_98);
      trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_80);
LAB_002e4905:
      local_624 = 0;
    }
    else {
      trieste::Token::Token(&local_5b0,(TokenDef *)Return);
      bVar1 = trieste::operator==((Node *)local_48,&local_5b0);
      if (bVar1) {
        peVar2 = ::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(in_RDX);
        pNVar5 = trieste::NodeDef::back(peVar2);
        bVar1 = ::std::operator==((shared_ptr<trieste::NodeDef> *)local_48,pNVar5);
        if (!bVar1) {
          __assert_fail("stmt == block->back()",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                        ,0x89,"Node verona::Infer::do_block(Node &)");
        }
        trieste::Token::Token(&local_5f8,(TokenDef *)Ref);
        trieste::operator/(&local_5f0,(Node *)local_48,&local_5f8);
        pNVar5 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_5f0);
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_5d0,pNVar5);
        gamma((verona *)&local_5c0,extraout_XMM0_Qa_02);
        std::shared_ptr<verona::BtypeDef>::shared_ptr
                  (&local_608,(shared_ptr<verona::BtypeDef> *)(block + 2));
        check((Infer *)block,&local_5c0,(Btype *)&local_608);
        std::shared_ptr<verona::BtypeDef>::~shared_ptr(&local_608);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_5c0);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_5d0);
        trieste::wf::detail::WFLookup::~WFLookup(&local_5f0);
        goto LAB_002e4905;
      }
      trieste::Token::Token(&local_610,(TokenDef *)Move);
      bVar1 = trieste::operator==((Node *)local_48,&local_610);
      if (!bVar1) {
        peVar2 = ::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        trieste::Token::Token(&local_658,(TokenDef *)Class);
        trieste::Token::Token(&local_650,(TokenDef *)TypeAlias);
        trieste::Token::Token(&local_648,(TokenDef *)LLVM);
        trieste::Token::Token(&local_640,(TokenDef *)Drop);
        local_638._M_array = &local_658;
        local_638._M_len = 4;
        bVar1 = trieste::NodeDef::in(peVar2,&local_638);
        if (!bVar1) {
          __assert_fail("stmt->in({Class, TypeAlias, LLVM, Drop})",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                        ,0x93,"Node verona::Infer::do_block(Node &)");
        }
        goto LAB_002e4905;
      }
      peVar2 = ::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RDX);
      pNVar5 = trieste::NodeDef::back(peVar2);
      bVar1 = ::std::operator==((shared_ptr<trieste::NodeDef> *)local_48,pNVar5);
      if (!bVar1) {
        __assert_fail("stmt == block->back()",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/typeinfer.cc"
                      ,0x8e,"Node verona::Infer::do_block(Node &)");
      }
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_620,(shared_ptr<trieste::NodeDef> *)local_48);
      gamma((verona *)this,extraout_XMM0_Qa_03);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_620);
      local_624 = 1;
    }
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_48);
    _Var6._M_pi = extraout_RDX;
    if (local_624 != 0) goto LAB_002e494d;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&__end2);
  }
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this);
  _Var6._M_pi = extraout_RDX_00;
LAB_002e494d:
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node do_block(Node& block)
    {
      for (auto stmt : *block)
      {
        if (stmt == Bind)
        {
          // TODO: literals
          auto rhs = stmt / Rhs;
          auto type = make_btype(stmt / Type);

          if (rhs == TypeTest)
            check(bool_type, type);
          else if (rhs == Cast)
            check(rhs / Type, type);
          else if (rhs->in({Move, Copy}))
            check(gamma(rhs), type);
          else if (rhs == FieldRef)
          {
            // TODO: Self substitution?
            // this is failing when `type` is a TypeVar, unclear why
            check(
              TypeView << -gamma(rhs / Ref)
                       << reftype(
                            cls->lookdown((rhs / Ident)->location()).front() /
                            Type),
              type);
          }
          else if (rhs == Conditional)
          {
            check(gamma(rhs / If), bool_type);
            check(do_block(rhs / True), type);
            check(do_block(rhs / False), type);
          }
          else if (rhs == Call)
          {
            auto sel = rhs / Selector;

            if (sel == FQFunction)
            {
              // TODO: may not have a function of this arity
              auto l = resolve_fq(sel);
              auto params = clone(l.def / Params);
              auto ret = clone(l.def / Type);
              auto args = rhs / Args;
              l.sub(params);
              l.sub(ret);

              (void)std::equal(
                params->begin(),
                params->end(),
                args->begin(),
                args->end(),
                [&](Node& param, Node& arg) {
                  check(gamma(arg), make_btype(param / Type));
                  return true;
                });

              check(ret, type);
            }
            else
            {
              // TODO: selector
            }
          }
          else if (rhs->in(
                     {Int,
                      Bin,
                      Oct,
                      Hex,
                      Float,
                      HexFloat,
                      Char,
                      Escaped,
                      String,
                      Tuple,
                      LLVM}))
          {
            // TODO:
          }
          else
          {
            assert(false);
          }
        }
        else if (stmt == Return)
        {
          assert(stmt == block->back());
          check(gamma(stmt / Ref), ret_type);
        }
        else if (stmt == Move)
        {
          assert(stmt == block->back());
          return gamma(stmt);
        }
        else
        {
          assert(stmt->in({Class, TypeAlias, LLVM, Drop}));
        }
      }

      return {};
    }